

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O2

void __thiscall
Js::ProbeContainer::DispatchInlineBreakpoint(ProbeContainer *this,InterpreterHaltState *pHaltState)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FunctionBody *pFVar4;
  ProbeContainer *local_38;
  FinallyObject local_30;
  
  Output::Trace(DebuggerPhase,
                L"ProbeContainer::DispatchInlineBreakpoint: start: this=%p, pHaltState=%p\n",this,
                pHaltState);
  bVar2 = CanDispatchHalt(this,pHaltState);
  if (bVar2) {
    if (pHaltState->stopType != STOP_INLINEBREAKPOINT) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                  ,0x164,"(pHaltState->stopType == STOP_INLINEBREAKPOINT)",
                                  "pHaltState->stopType == STOP_INLINEBREAKPOINT");
      if (!bVar2) goto LAB_007fd280;
      *puVar3 = 0;
    }
    local_30.finallyFunc = (anon_class_48_6_9e8417c9 *)&local_38;
    local_30.abnormalTermination = true;
    local_38 = this;
    InitializeLocation(this,pHaltState,true);
    bVar2 = InterpreterHaltState::IsValid(pHaltState);
    Output::Trace(DebuggerPhase,
                  L"ProbeContainer::DispatchInlineBreakpoint: initialized location: pHaltState=%p, pHaltState->IsValid()=%d\n"
                  ,pHaltState,(ulong)bVar2);
    bVar2 = InterpreterHaltState::IsValid(pHaltState);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                  ,0x16c,"(pHaltState->IsValid())","pHaltState->IsValid()");
      if (!bVar2) {
LAB_007fd280:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    bVar2 = InterpreterHaltState::IsValid(pHaltState);
    if (bVar2) {
      pFVar4 = InterpreterHaltState::GetFunction(pHaltState);
      FunctionBody::MustBeInDebugMode(pFVar4);
      StepController::Deactivate(&this->debugManager->stepController,pHaltState);
      AsyncBreakController::Deactivate(&this->debugManager->asyncBreakController);
      pFVar4 = InterpreterHaltState::GetFunction(pHaltState);
      FunctionBody::CheckAndRegisterFuncToDiag(pFVar4,this->pScriptContext);
      (*this->haltCallbackProbe->_vptr_HaltCallback[1])(this->haltCallbackProbe,pHaltState);
    }
    local_30.abnormalTermination = false;
    anon_func::FinallyObject::~FinallyObject(&local_30);
    Output::Trace(DebuggerPhase,L"ProbeContainer::DispatchInlineBreakpoint: end: pHaltState=%p\n",
                  pHaltState);
  }
  return;
}

Assistant:

void ProbeContainer::DispatchInlineBreakpoint(InterpreterHaltState* pHaltState)
    {
        OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchInlineBreakpoint: start: this=%p, pHaltState=%p\n"), this, pHaltState);

        if (!CanDispatchHalt(pHaltState))
        {
            return;
        }

        Assert(pHaltState->stopType == STOP_INLINEBREAKPOINT);

        TryFinally([&]()
        {
            InitializeLocation(pHaltState);
            OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchInlineBreakpoint: initialized location: pHaltState=%p, pHaltState->IsValid()=%d\n"),
                pHaltState, pHaltState->IsValid());

            Assert(pHaltState->IsValid());

            // The ByteCodeReader should be available at this point, but because of possibility of garbled frame, we shouldn't hit AV
            if (pHaltState->IsValid())
            {
#if DBG
                pHaltState->GetFunction()->MustBeInDebugMode();
#endif

                // an inline breakpoint is being dispatched deactivate other stopping controllers
                debugManager->stepController.Deactivate(pHaltState);
                debugManager->asyncBreakController.Deactivate();

                pHaltState->GetFunction()->CheckAndRegisterFuncToDiag(pScriptContext);

                haltCallbackProbe->DispatchHalt(pHaltState);
            }
        },
        [&](bool)
        {
            DestroyLocation();
        });

        OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchInlineBreakpoint: end: pHaltState=%p\n"), pHaltState);
    }